

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_get_record_expansion(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_transform *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  int iVar3;
  undefined8 in_R9;
  
  pmVar1 = ssl->transform_out;
  if (pmVar1 == (mbedtls_ssl_transform *)0x0) {
    return (uint)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 5;
  }
  pmVar2 = (pmVar1->cipher_ctx_enc).cipher_info;
  if (pmVar2 != (mbedtls_cipher_info_t *)0x0) {
    if (pmVar2->mode - MBEDTLS_MODE_GCM < 3) {
      iVar3 = (int)pmVar1->minlen;
    }
    else {
      if (pmVar2->mode != MBEDTLS_MODE_CBC) goto LAB_0014f0b0;
      iVar3 = pmVar2->block_size + (int)pmVar1->maclen;
    }
    return iVar3 + (uint)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 5;
  }
LAB_0014f0b0:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x17d5,"should never happen",in_R9,pmVar1);
  return -0x6c00;
}

Assistant:

int mbedtls_ssl_get_record_expansion( const mbedtls_ssl_context *ssl )
{
    size_t transform_expansion;
    const mbedtls_ssl_transform *transform = ssl->transform_out;

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->session_out->compression != MBEDTLS_SSL_COMPRESS_NULL )
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
#endif

    if( transform == NULL )
        return( (int) mbedtls_ssl_hdr_len( ssl ) );

    switch( mbedtls_cipher_get_cipher_mode( &transform->cipher_ctx_enc ) )
    {
        case MBEDTLS_MODE_GCM:
        case MBEDTLS_MODE_CCM:
        case MBEDTLS_MODE_STREAM:
            transform_expansion = transform->minlen;
            break;

        case MBEDTLS_MODE_CBC:
            transform_expansion = transform->maclen
                      + mbedtls_cipher_get_block_size( &transform->cipher_ctx_enc );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    return( (int)( mbedtls_ssl_hdr_len( ssl ) + transform_expansion ) );
}